

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O1

bool readSolutionFileHashKeywordIntLineOk(string *keyword,HighsInt *value,ifstream *in_file)

{
  if (((((&(in_file->super_basic_istream<char,_std::char_traits<char>_>).field_0x20)
         [(long)(in_file->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream
                [-3]] & 2) == 0) &&
      (std::operator>>(&in_file->super_basic_istream<char,_std::char_traits<char>_>,
                       (string *)keyword),
      ((&(in_file->super_basic_istream<char,_std::char_traits<char>_>).field_0x20)
       [(long)(in_file->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream[-3]]
      & 2) == 0)) &&
     (std::operator>>(&in_file->super_basic_istream<char,_std::char_traits<char>_>,(string *)keyword
                     ),
     ((&(in_file->super_basic_istream<char,_std::char_traits<char>_>).field_0x20)
      [(long)(in_file->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream[-3]]
     & 2) == 0)) {
    std::istream::operator>>(in_file,value);
    return true;
  }
  return false;
}

Assistant:

bool readSolutionFileHashKeywordIntLineOk(std::string& keyword, HighsInt& value,
                                          std::ifstream& in_file) {
  if (in_file.eof()) return false;
  in_file >> keyword;  // #
  if (in_file.eof()) return false;
  in_file >> keyword;  // keyword
  if (in_file.eof()) return false;
  in_file >> value;  // integer value
  return true;
}